

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

int qtree_encode64(char *outfile,LONGLONG *a,int n,int nqx,int nqy,int nbitplanes)

{
  ulong uVar1;
  char *outfile_00;
  LONGLONG *a_00;
  int iVar2;
  int iVar3;
  uchar *b_00;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint bits;
  int iVar7;
  uchar *buffer;
  int iVar8;
  double dVar9;
  int b;
  int local_74;
  char *local_70;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  uchar *local_50;
  ulong local_48;
  LONGLONG *local_40;
  ulong local_38;
  
  iVar5 = nqy;
  if (nqy < nqx) {
    iVar5 = nqx;
  }
  local_74 = n;
  local_70 = outfile;
  local_40 = a;
  dVar9 = log((double)iVar5);
  iVar4 = (int)(dVar9 / 0.6931471805599453 + 0.5);
  uVar1 = (long)(((nqy + 1) / 2) * ((nqx + 1) / 2) + 1) / 2;
  iVar8 = (int)uVar1;
  local_68 = (ulong)(uint)nqy;
  local_48 = (ulong)(uint)nqx;
  b_00 = (uchar *)malloc((long)(iVar8 * 2));
  local_38 = uVar1 & 0xffffffff;
  local_50 = (uchar *)malloc((long)iVar8);
  uVar1 = local_48;
  if (local_50 == (uchar *)0x0 || b_00 == (uchar *)0x0) {
    ffpmsg("qtree_encode64: insufficient memory");
    iVar5 = 0x19d;
  }
  else {
    local_58 = nqx + 1 >> 1;
    local_5c = nqy + 1 >> 1;
    local_54 = local_5c * local_58;
    buffer = local_50;
LAB_001b9ef0:
    a_00 = local_40;
    iVar8 = local_74;
    if (0 < nbitplanes) {
      b = 0;
      bitbuffer = 0;
      nbitplanes = nbitplanes + -1;
      bits_to_go3 = 0;
      qtree_onebit64(local_40,local_74,(int)uVar1,(int)local_68,b_00,nbitplanes);
      iVar2 = bufcopy(b_00,local_54,buffer,&b,(int)local_38);
      buffer = local_50;
      if (iVar2 == 0) {
        iVar7 = 0;
        iVar8 = local_58;
        iVar2 = local_5c;
        do {
          outfile_00 = local_70;
          iVar7 = iVar7 + 1;
          if ((int)((uint)(1 << ((byte)iVar4 & 0x1f) < iVar5) + iVar4) <= iVar7) {
            output_nybble(local_70,0xf);
            uVar6 = (ulong)(uint)b;
            if (uVar6 == 0) {
              if (bits_to_go3 < 1) {
                output_nbits(outfile_00,0x3e,6);
              }
              else {
                output_nbits(outfile_00,~(-1 << ((byte)bits_to_go3 & 0x1f)) & bitbuffer,bits_to_go3)
                ;
              }
            }
            else {
              if (bits_to_go3 < 1) goto LAB_001ba07b;
              bits = ~(-1 << ((byte)bits_to_go3 & 0x1f)) & bitbuffer;
              iVar8 = bits_to_go3;
              while( true ) {
                output_nbits(outfile_00,bits,iVar8);
LAB_001ba07b:
                if ((int)uVar6 < 1) break;
                bits = (uint)buffer[uVar6 - 1];
                uVar6 = uVar6 - 1;
                iVar8 = 8;
              }
            }
            goto LAB_001b9ef0;
          }
          qtree_reduce(b_00,iVar2,iVar8,iVar2,b_00);
          iVar8 = iVar8 + 1 >> 1;
          iVar2 = iVar2 + 1 >> 1;
          iVar3 = bufcopy(b_00,iVar2 * iVar8,buffer,&b,(int)local_38);
        } while (iVar3 == 0);
        write_bdirect64(local_70,local_40,local_74,(int)local_48,(int)local_68,b_00,nbitplanes);
      }
      else {
        write_bdirect64(local_70,a_00,iVar8,(int)uVar1,(int)local_68,b_00,nbitplanes);
        buffer = local_50;
      }
      goto LAB_001b9ef0;
    }
    free(buffer);
    free(b_00);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
qtree_encode64(char *outfile, LONGLONG a[], int n, int nqx, int nqy, int nbitplanes)
{

/*
LONGLONG a[];
int n;								 physical dimension of row in a		
int nqx;							 length of row			
int nqy;							 length of column (<=n)				
int nbitplanes;						 number of bit planes to output	
*/
	
int log2n, i, k, bit, b, nqmax, nqx2, nqy2, nx, ny;
int bmax;  /* this potentially needs to be made a 64-bit int to support large arrays */
unsigned char *scratch, *buffer;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * initialize buffer point, max buffer size
	 */
	nqx2 = (nqx+1)/2;
	nqy2 = (nqy+1)/2;
	bmax = (( nqx2)* ( nqy2)+1)/2;
	/*
	 * We're indexing A as a 2-D array with dimensions (nqx,nqy).
	 * Scratch is 2-D with dimensions (nqx/2,nqy/2) rounded up.
	 * Buffer is used to store string of codes for output.
	 */
	scratch = (unsigned char *) malloc(2*bmax);
	buffer = (unsigned char *) malloc(bmax);
	if ((scratch == (unsigned char *) NULL) ||
		(buffer  == (unsigned char *) NULL)) {
		ffpmsg("qtree_encode64: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	/*
	 * now encode each bit plane, starting with the top
	 */
	for (bit=nbitplanes-1; bit >= 0; bit--) {
		/*
		 * initial bit buffer
		 */
		b = 0;
		bitbuffer = 0;
		bits_to_go3 = 0;
		/*
		 * on first pass copy A to scratch array
		 */
		qtree_onebit64(a,n,nqx,nqy,scratch,bit);
		nx = (nqx+1)>>1;
		ny = (nqy+1)>>1;
		/*
		 * copy non-zero values to output buffer, which will be written
		 * in reverse order
		 */
		if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
			/*
			 * quadtree is expanding data,
			 * change warning code and just fill buffer with bit-map
			 */
			write_bdirect64(outfile,a,n,nqx,nqy,scratch,bit);
			goto bitplane_done;
		}
		/*
		 * do log2n reductions
		 */
		for (k = 1; k<log2n; k++) {
			qtree_reduce(scratch,ny,nx,ny,scratch);
			nx = (nx+1)>>1;
			ny = (ny+1)>>1;
			if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
				write_bdirect64(outfile,a,n,nqx,nqy,scratch,bit);
				goto bitplane_done;
			}
		}
		/*
		 * OK, we've got the code in buffer
		 * Write quadtree warning code, then write buffer in reverse order
		 */
		output_nybble(outfile,0xF);
		if (b==0) {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			} else {
				/*
				 * have to write a zero nybble if there are no 1's in array
				 */
				output_huffman(outfile,0);
			}
		} else {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			}
			for (i=b-1; i>=0; i--) {
				output_nbits(outfile,buffer[i],8);
			}
		}
		bitplane_done: ;
	}
	free(buffer);
	free(scratch);
	return(0);
}